

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.h
# Opt level: O1

int exception_target_el(CPUARMState_conflict *env)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  bool bVar5;
  
  uVar1 = env->features;
  uVar3 = (uint)uVar1;
  if ((uVar3 >> 9 & 1) == 0) {
    if (env->aarch64 == 0) {
      if ((env->uncached_cpsr & 0x1f) == 0x10) {
        uVar4 = 0;
      }
      else {
        uVar4 = 1;
      }
    }
    else {
      uVar4 = env->pstate >> 2 & 3;
    }
  }
  else {
    uVar4 = 1;
    if ((env->v7m).exception == 0) {
      uVar4 = ~(env->v7m).control[(env->v7m).secure] & 1;
    }
  }
  uVar2 = 1;
  if (uVar4 != 0) {
    if ((uVar3 >> 9 & 1) == 0) {
      if (env->aarch64 == 0) {
        uVar4 = env->uncached_cpsr & 0x1f;
        if (uVar4 == 0x10) {
          uVar2 = 0;
        }
        else if (uVar4 == 0x16) {
          uVar2 = 3;
        }
        else if (uVar4 == 0x1a) {
          uVar2 = 2;
        }
        else {
          if ((uVar1 & 0x200000000) != 0) {
            bVar5 = uVar4 == 0x16;
            if (!bVar5) {
              bVar5 = ((env->cp15).scr_el3 & 1) == 0;
            }
            if (((uVar3 >> 0x1c & 1) == 0) && (uVar2 = 3, bVar5)) goto LAB_0062fa91;
          }
          uVar2 = 1;
        }
      }
      else {
        uVar2 = env->pstate >> 2 & 3;
      }
    }
    else if ((env->v7m).exception == 0) {
      uVar2 = ~(env->v7m).control[(env->v7m).secure] & 1;
    }
  }
LAB_0062fa91:
  if ((uVar1 & 0x200000000) != 0) {
    if (env->aarch64 == 0) {
      bVar5 = (env->uncached_cpsr & 0x1f) == 0x16;
    }
    else {
      bVar5 = (~env->pstate & 0xc) == 0;
    }
    if (!bVar5) {
      bVar5 = ((env->cp15).scr_el3 & 1) == 0;
    }
    if (bVar5) {
      uVar3 = 3;
      if (uVar2 != 1) {
        uVar3 = uVar2;
      }
      if ((uVar1 & 0x10000000) == 0) {
        uVar2 = uVar3;
      }
    }
  }
  return uVar2;
}

Assistant:

static inline int arm_feature(CPUARMState *env, int feature)
{
    return (env->features & (1ULL << feature)) != 0;
}